

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileLibraryTargetGenerator::WriteNvidiaDeviceLibraryRules
          (cmMakefileLibraryTargetGenerator *this,string *linkRuleVar,bool relink,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,string *targetOutput)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  cmList *this_01;
  cmGeneratorTarget *pcVar1;
  cmLocalUnixMakefileGenerator3 *pcVar2;
  cmMakefile *this_02;
  string_view sVar3;
  undefined8 __value;
  bool linkScriptShell;
  bool bVar4;
  bool forResponse;
  cmLinkLineDeviceComputer *this_03;
  cmLinkLineComputer *pcVar5;
  type linkLineComputer_00;
  string *psVar6;
  pointer pcVar7;
  iterator __first;
  char *name_00;
  container_type *pcVar8;
  string *relDir;
  type os;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_631;
  undefined1 local_630 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputs;
  char *name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands1;
  string local_5e8;
  reference local_5c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *real_link_command;
  iterator __end1;
  iterator __begin1;
  cmList *__range1;
  undefined1 local_5a0 [8];
  string linkRule;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  string local_570;
  string_view local_550;
  allocator<char> local_539;
  string local_538;
  allocator<char> local_511;
  string local_510;
  undefined1 local_4f0 [8];
  string val;
  string launcher;
  undefined1 local_4a0 [8];
  string targetOutPathCompilePDB;
  undefined1 local_460 [8];
  string targetFullPathCompilePDB;
  undefined1 local_410 [8];
  string target;
  string local_3c0;
  undefined1 local_3a0 [8];
  string objectDir;
  string buildObjs;
  undefined1 local_340 [8];
  string ignored_;
  string linkFlags;
  cmStateDirectory local_2e8;
  unique_ptr<cmLinkLineDeviceComputer,_std::default_delete<cmLinkLineDeviceComputer>_> local_2c0;
  unique_ptr<cmLinkLineDeviceComputer,_std::default_delete<cmLinkLineDeviceComputer>_>
  linkLineComputer;
  string linkLibs;
  cmList real_link_commands;
  RuleVariables vars;
  bool useResponseFileForLibs;
  bool useResponseFileForObjects;
  bool useLinkScript;
  string local_110;
  undefined1 local_f0 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libCleanFiles;
  undefined1 local_a0 [8];
  string langFlags;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string linkLanguage;
  string *targetOutput_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *commands_local;
  bool relink_local;
  string *linkRuleVar_local;
  cmMakefileLibraryTargetGenerator *this_local;
  
  linkLanguage.field_2._8_8_ = targetOutput;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_50,"CUDA",&local_51);
  std::allocator<char>::~allocator(&local_51);
  this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&langFlags.field_2 + 8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(this_00);
  cmMakefileTargetGenerator::AppendLinkDepends
            (&this->super_cmMakefileTargetGenerator,this_00,(string *)local_50);
  std::__cxx11::string::string((string *)local_a0);
  pcVar1 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            ((string *)&libCleanFiles._M_t._M_impl.super__Rb_tree_header._M_node_count,
             &this->super_cmMakefileTargetGenerator);
  cmLocalGenerator::AddLanguageFlagsForLinking
            ((cmLocalGenerator *)pcVar2,(string *)local_a0,pcVar1,(string *)local_50,
             (string *)&libCleanFiles._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string
            ((string *)&libCleanFiles._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_f0);
  cmOutputConverter::MaybeRelativeToCurBinDir
            (&local_110,(cmOutputConverter *)(this->super_cmMakefileTargetGenerator).LocalGenerator,
             (string *)linkLanguage.field_2._8_8_);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_f0,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  linkScriptShell =
       cmGlobalGenerator::GetUseLinkScript
                 ((cmGlobalGenerator *)(this->super_cmMakefileTargetGenerator).GlobalGenerator);
  bVar4 = cmMakefileTargetGenerator::CheckUseResponseFileForObjects
                    (&this->super_cmMakefileTargetGenerator,(string *)local_50);
  forResponse = cmMakefileTargetGenerator::CheckUseResponseFileForLibraries
                          (&this->super_cmMakefileTargetGenerator,(string *)local_50);
  cmRulePlaceholderExpander::RuleVariables::RuleVariables
            ((RuleVariables *)
             &real_link_commands.Values.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::c_str();
  cmList::cmList((cmList *)((long)&linkLibs.field_2 + 8));
  cmOutputConverter::SetLinkScriptShell
            ((cmOutputConverter *)(this->super_cmMakefileTargetGenerator).LocalGenerator,
             linkScriptShell);
  std::__cxx11::string::string((string *)&linkLineComputer);
  this_03 = (cmLinkLineDeviceComputer *)operator_new(0x40);
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  cmLocalGenerator::GetStateSnapshot
            ((cmStateSnapshot *)((long)&linkFlags.field_2 + 8),(cmLocalGenerator *)pcVar2);
  cmStateSnapshot::GetDirectory(&local_2e8,(cmStateSnapshot *)((long)&linkFlags.field_2 + 8));
  cmLinkLineDeviceComputer::cmLinkLineDeviceComputer(this_03,(cmOutputConverter *)pcVar2,&local_2e8)
  ;
  std::unique_ptr<cmLinkLineDeviceComputer,std::default_delete<cmLinkLineDeviceComputer>>::
  unique_ptr<std::default_delete<cmLinkLineDeviceComputer>,void>
            ((unique_ptr<cmLinkLineDeviceComputer,std::default_delete<cmLinkLineDeviceComputer>> *)
             &local_2c0,this_03);
  pcVar5 = &std::
            unique_ptr<cmLinkLineDeviceComputer,_std::default_delete<cmLinkLineDeviceComputer>_>::
            operator->(&local_2c0)->super_cmLinkLineComputer;
  cmLinkLineComputer::SetForResponse(pcVar5,forResponse);
  pcVar5 = &std::
            unique_ptr<cmLinkLineDeviceComputer,_std::default_delete<cmLinkLineDeviceComputer>_>::
            operator->(&local_2c0)->super_cmLinkLineComputer;
  cmLinkLineComputer::SetRelink(pcVar5,relink);
  std::__cxx11::string::string((string *)(ignored_.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_340);
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  linkLineComputer_00 =
       std::unique_ptr<cmLinkLineDeviceComputer,_std::default_delete<cmLinkLineDeviceComputer>_>::
       operator*(&local_2c0);
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            ((string *)((long)&buildObjs.field_2 + 8),&this->super_cmMakefileTargetGenerator);
  cmLocalGenerator::GetDeviceLinkFlags
            ((cmLocalGenerator *)pcVar2,linkLineComputer_00,(string *)((long)&buildObjs.field_2 + 8)
             ,(string *)local_340,(string *)((long)&ignored_.field_2 + 8),(string *)local_340,
             (string *)local_340,
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
  std::__cxx11::string::~string((string *)(buildObjs.field_2._M_local_buf + 8));
  pcVar5 = &std::
            unique_ptr<cmLinkLineDeviceComputer,_std::default_delete<cmLinkLineDeviceComputer>_>::
            get(&local_2c0)->super_cmLinkLineComputer;
  cmMakefileTargetGenerator::CreateLinkLibs
            (&this->super_cmMakefileTargetGenerator,pcVar5,(string *)&linkLineComputer,forResponse,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&langFlags.field_2 + 8),(string *)local_50,DeviceLink);
  std::__cxx11::string::string((string *)(objectDir.field_2._M_local_buf + 8));
  cmMakefileTargetGenerator::CreateObjectLists
            (&this->super_cmMakefileTargetGenerator,linkScriptShell,false,bVar4,
             (string *)(objectDir.field_2._M_local_buf + 8),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&langFlags.field_2 + 8),false,(string *)local_50,DeviceLink);
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
            ((string *)local_3a0,
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  cmOutputConverter::MaybeRelativeToCurBinDir
            ((string *)((long)&target.field_2 + 8),(cmOutputConverter *)pcVar2,(string *)local_3a0);
  sVar3 = (string_view)
          std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)(target.field_2._M_local_buf + 8));
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&local_3c0,(cmOutputConverter *)pcVar2,sVar3,SHELL,false);
  std::__cxx11::string::operator=((string *)local_3a0,(string *)&local_3c0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::__cxx11::string::~string((string *)(target.field_2._M_local_buf + 8));
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  cmOutputConverter::MaybeRelativeToCurBinDir
            ((string *)((long)&targetFullPathCompilePDB.field_2 + 8),(cmOutputConverter *)pcVar2,
             (string *)linkLanguage.field_2._8_8_);
  sVar3 = (string_view)
          std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)(targetFullPathCompilePDB.field_2._M_local_buf + 8));
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            ((string *)local_410,(cmOutputConverter *)pcVar2,sVar3,SHELL,false);
  std::__cxx11::string::~string((string *)(targetFullPathCompilePDB.field_2._M_local_buf + 8));
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            ((string *)((long)&targetOutPathCompilePDB.field_2 + 8),
             &this->super_cmMakefileTargetGenerator);
  cmCommonTargetGenerator::ComputeTargetCompilePDB
            ((string *)local_460,(cmCommonTargetGenerator *)this,
             (string *)((long)&targetOutPathCompilePDB.field_2 + 8));
  std::__cxx11::string::~string((string *)(targetOutPathCompilePDB.field_2._M_local_buf + 8));
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  sVar3 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_460)
  ;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            ((string *)local_4a0,(cmOutputConverter *)pcVar2,sVar3,SHELL,false);
  std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  std::__cxx11::string::string((string *)(val.field_2._M_local_buf + 8));
  pcVar1 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_510,"RULE_LAUNCH_LINK",&local_511);
  this_02 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_538,"CMAKE_BUILD_TYPE",&local_539);
  psVar6 = cmMakefile::GetSafeDefinition(this_02,&local_538);
  cmLocalGenerator::GetRuleLauncher
            ((string *)local_4f0,(cmLocalGenerator *)pcVar2,pcVar1,&local_510,psVar6);
  std::__cxx11::string::~string((string *)&local_538);
  std::allocator<char>::~allocator(&local_539);
  std::__cxx11::string::~string((string *)&local_510);
  std::allocator<char>::~allocator(&local_511);
  local_550 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_4f0);
  bVar4 = cmNonempty(local_550);
  if (bVar4) {
    rulePlaceholderExpander._M_t.
    super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
    .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl._7_1_ = 0x20;
    cmStrCat<std::__cxx11::string&,char>
              (&local_570,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f0,
               (char *)((long)&rulePlaceholderExpander._M_t.
                               super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
                               .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>.
                               _M_head_impl + 7));
    std::__cxx11::string::operator=((string *)(val.field_2._M_local_buf + 8),(string *)&local_570);
    std::__cxx11::string::~string((string *)&local_570);
  }
  (*(((this->super_cmMakefileTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator).
    super_cmLocalGenerator.super_cmOutputConverter._vptr_cmOutputConverter[6])
            ((undefined1 *)((long)&linkRule.field_2 + 8));
  pcVar7 = std::
           unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
           operator->((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                       *)((long)&linkRule.field_2 + 8));
  cmRulePlaceholderExpander::SetTargetImpLib(pcVar7,(string *)linkLanguage.field_2._8_8_);
  cmMakefileTargetGenerator::GetLinkRule
            ((string *)local_5a0,&this->super_cmMakefileTargetGenerator,linkRuleVar);
  cmList::append((cmList *)((long)&linkLibs.field_2 + 8),(string *)local_5a0,Yes,No);
  this_01 = (cmList *)((long)&linkLibs.field_2 + 8);
  __end1 = cmList::begin_abi_cxx11_(this_01);
  real_link_command =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       cmList::end_abi_cxx11_(this_01);
  while( true ) {
    bVar4 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&real_link_command);
    if (!bVar4) break;
    local_5c8 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1);
    cmStrCat<std::__cxx11::string&,std::__cxx11::string&>
              (&local_5e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&val.field_2 + 8),local_5c8);
    std::__cxx11::string::operator=((string *)local_5c8,(string *)&local_5e8);
    std::__cxx11::string::~string((string *)&local_5e8);
    pcVar7 = std::
             unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
             ::operator->((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                           *)((long)&linkRule.field_2 + 8));
    cmRulePlaceholderExpander::ExpandRuleVariables
              (pcVar7,(cmOutputConverter *)(this->super_cmMakefileTargetGenerator).LocalGenerator,
               local_5c8,
               (RuleVariables *)
               &real_link_commands.Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  cmOutputConverter::SetLinkScriptShell
            ((cmOutputConverter *)(this->super_cmMakefileTargetGenerator).LocalGenerator,false);
  __first = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_f0);
  commands1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_f0);
  std::
  set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
  insert<std::_Rb_tree_const_iterator<std::__cxx11::string>>
            ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&(this->super_cmMakefileTargetGenerator).CleanFiles,
             (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__first._M_node,
             (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )commands1.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_5a0);
  std::unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
  ~unique_ptr((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
               *)((long)&linkRule.field_2 + 8));
  std::__cxx11::string::~string((string *)local_4f0);
  std::__cxx11::string::~string((string *)(val.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_4a0);
  std::__cxx11::string::~string((string *)local_460);
  std::__cxx11::string::~string((string *)local_410);
  std::__cxx11::string::~string((string *)local_3a0);
  std::__cxx11::string::~string((string *)(objectDir.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_340);
  std::__cxx11::string::~string((string *)(ignored_.field_2._M_local_buf + 8));
  std::unique_ptr<cmLinkLineDeviceComputer,_std::default_delete<cmLinkLineDeviceComputer>_>::
  ~unique_ptr(&local_2c0);
  std::__cxx11::string::~string((string *)&linkLineComputer);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&name);
  if (linkScriptShell) {
    name_00 = "dlink.txt";
    if (relink) {
      name_00 = "drelink.txt";
    }
    outputs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)name_00;
    pcVar8 = cmList::operator_cast_to_vector_((cmList *)((long)&linkLibs.field_2 + 8));
    cmMakefileTargetGenerator::CreateLinkScript
              (&this->super_cmMakefileTargetGenerator,name_00,pcVar8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&name,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)&langFlags.field_2 + 8));
  }
  else {
    pcVar8 = cmList::operator_cast_to_vector_((cmList *)((long)&linkLibs.field_2 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&name,pcVar8);
  }
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  psVar6 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                     ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.Makefile
                     );
  relDir = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                     ((cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator);
  cmLocalUnixMakefileGenerator3::CreateCDCommand
            (pcVar2,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&name,psVar6,relDir);
  ::cm::
  append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
            (commands,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&name);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&name);
  __value = linkLanguage.field_2._8_8_;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_631);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_630,1,(value_type *)__value,&local_631);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_631);
  os = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
       operator*(&(this->super_cmMakefileTargetGenerator).BuildFileStream);
  cmMakefileTargetGenerator::WriteMakeRule
            (&this->super_cmMakefileTargetGenerator,(ostream *)os,(char *)0x0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_630,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&langFlags.field_2 + 8),commands,false);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_630);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&name);
  cmList::~cmList((cmList *)((long)&linkLibs.field_2 + 8));
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_f0);
  std::__cxx11::string::~string((string *)local_a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&langFlags.field_2 + 8));
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void cmMakefileLibraryTargetGenerator::WriteNvidiaDeviceLibraryRules(
  const std::string& linkRuleVar, bool relink,
  std::vector<std::string>& commands, const std::string& targetOutput)
{
  std::string linkLanguage = "CUDA";

  // Build list of dependencies.
  std::vector<std::string> depends;
  this->AppendLinkDepends(depends, linkLanguage);

  // Add language-specific flags.
  std::string langFlags;
  this->LocalGenerator->AddLanguageFlagsForLinking(
    langFlags, this->GeneratorTarget, linkLanguage, this->GetConfigName());

  // Clean files associated with this library.
  std::set<std::string> libCleanFiles;
  libCleanFiles.insert(
    this->LocalGenerator->MaybeRelativeToCurBinDir(targetOutput));

  // Determine whether a link script will be used.
  bool useLinkScript = this->GlobalGenerator->GetUseLinkScript();

  bool useResponseFileForObjects =
    this->CheckUseResponseFileForObjects(linkLanguage);
  bool const useResponseFileForLibs =
    this->CheckUseResponseFileForLibraries(linkLanguage);

  cmRulePlaceholderExpander::RuleVariables vars;
  vars.Language = linkLanguage.c_str();

  // Expand the rule variables.
  cmList real_link_commands;
  {
    // Set path conversion for link script shells.
    this->LocalGenerator->SetLinkScriptShell(useLinkScript);

    // Collect up flags to link in needed libraries.
    std::string linkLibs;
    std::unique_ptr<cmLinkLineDeviceComputer> linkLineComputer(
      new cmLinkLineDeviceComputer(
        this->LocalGenerator,
        this->LocalGenerator->GetStateSnapshot().GetDirectory()));
    linkLineComputer->SetForResponse(useResponseFileForLibs);
    linkLineComputer->SetRelink(relink);

    // Create set of linking flags.
    std::string linkFlags;
    std::string ignored_;
    this->LocalGenerator->GetDeviceLinkFlags(
      *linkLineComputer, this->GetConfigName(), ignored_, linkFlags, ignored_,
      ignored_, this->GeneratorTarget);

    this->CreateLinkLibs(
      linkLineComputer.get(), linkLibs, useResponseFileForLibs, depends,
      linkLanguage, cmMakefileTargetGenerator::ResponseFlagFor::DeviceLink);

    // Construct object file lists that may be needed to expand the
    // rule.
    std::string buildObjs;
    this->CreateObjectLists(
      useLinkScript, false, // useArchiveRules
      useResponseFileForObjects, buildObjs, depends, false, linkLanguage,
      cmMakefileTargetGenerator::ResponseFlagFor::DeviceLink);

    std::string objectDir = this->GeneratorTarget->GetSupportDirectory();
    objectDir = this->LocalGenerator->ConvertToOutputFormat(
      this->LocalGenerator->MaybeRelativeToCurBinDir(objectDir),
      cmOutputConverter::SHELL);

    std::string target = this->LocalGenerator->ConvertToOutputFormat(
      this->LocalGenerator->MaybeRelativeToCurBinDir(targetOutput),
      cmOutputConverter::SHELL);

    std::string targetFullPathCompilePDB =
      this->ComputeTargetCompilePDB(this->GetConfigName());
    std::string targetOutPathCompilePDB =
      this->LocalGenerator->ConvertToOutputFormat(targetFullPathCompilePDB,
                                                  cmOutputConverter::SHELL);

    vars.Objects = buildObjs.c_str();
    vars.ObjectDir = objectDir.c_str();
    vars.Target = target.c_str();
    vars.LinkLibraries = linkLibs.c_str();
    vars.ObjectsQuoted = buildObjs.c_str();
    vars.LanguageCompileFlags = langFlags.c_str();
    vars.LinkFlags = linkFlags.c_str();
    vars.TargetCompilePDB = targetOutPathCompilePDB.c_str();

    std::string launcher;
    std::string val = this->LocalGenerator->GetRuleLauncher(
      this->GeneratorTarget, "RULE_LAUNCH_LINK",
      this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
    if (cmNonempty(val)) {
      launcher = cmStrCat(val, ' ');
    }

    auto rulePlaceholderExpander =
      this->LocalGenerator->CreateRulePlaceholderExpander();

    // Construct the main link rule and expand placeholders.
    rulePlaceholderExpander->SetTargetImpLib(targetOutput);
    std::string linkRule = this->GetLinkRule(linkRuleVar);
    real_link_commands.append(linkRule);

    // Expand placeholders.
    for (auto& real_link_command : real_link_commands) {
      real_link_command = cmStrCat(launcher, real_link_command);
      rulePlaceholderExpander->ExpandRuleVariables(this->LocalGenerator,
                                                   real_link_command, vars);
    }
    // Restore path conversion to normal shells.
    this->LocalGenerator->SetLinkScriptShell(false);

    // Clean all the possible library names and symlinks.
    this->CleanFiles.insert(libCleanFiles.begin(), libCleanFiles.end());
  }

  std::vector<std::string> commands1;
  // Optionally convert the build rule to use a script to avoid long
  // command lines in the make shell.
  if (useLinkScript) {
    // Use a link script.
    const char* name = (relink ? "drelink.txt" : "dlink.txt");
    this->CreateLinkScript(name, real_link_commands, commands1, depends);
  } else {
    // No link script.  Just use the link rule directly.
    commands1 = real_link_commands;
  }
  this->LocalGenerator->CreateCDCommand(
    commands1, this->Makefile->GetCurrentBinaryDirectory(),
    this->LocalGenerator->GetBinaryDirectory());
  cm::append(commands, commands1);
  commands1.clear();

  // Compute the list of outputs.
  std::vector<std::string> outputs(1, targetOutput);

  // Write the build rule.
  this->WriteMakeRule(*this->BuildFileStream, nullptr, outputs, depends,
                      commands, false);
#else
  static_cast<void>(linkRuleVar);
  static_cast<void>(relink);
#endif
}